

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

void __thiscall crnlib::crn_block_compressor::crn_block_compressor(crn_block_compressor *this)

{
  crn_block_compressor *this_local;
  
  dxt_image::dxt_image(&this->m_image);
  crn_comp_params::crn_comp_params(&this->m_comp_params);
  dxt_image::pack_params::pack_params(&this->m_pack_params);
  dxt_image::set_block_pixels_context::set_block_pixels_context(&this->m_set_block_pixels_context);
  return;
}

Assistant:

crn_block_compressor()
        {
        }